

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void update_timer(void)

{
  undefined1 local_18 [8];
  timeval timev;
  
  gettimeofday((timeval *)local_18,(__timezone_ptr_t)0x0);
  MiscStats->secondsclock = local_18._0_4_ + 0x81c94b00;
  MiscStats->secondstmp = local_18._0_4_ + 0x81c94b00;
  return;
}

Assistant:

void update_timer(void) {
#ifdef DOS
  MiscStats->secondstmp = MiscStats->secondsclock = time(0) + UNIX_ALTO_TIME_DIFF;
#else
  struct timeval timev;
  gettimeofday(&timev, NIL);
  MiscStats->secondstmp = MiscStats->secondsclock = (timev.tv_sec + UNIX_ALTO_TIME_DIFF);
#endif /* DOS */
}